

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgcprll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
            int writemode,double *scale,double *zero,char *tform,long *twidth,int *tcode,
            int *maxelem,LONGLONG *startpos,LONGLONG *elemnum,long *incre,LONGLONG *repeat,
            LONGLONG *rowlen,int *hdutype,LONGLONG *tnull,char *snull,int *status)

{
  LONGLONG *pLVar1;
  FITSfile *pFVar2;
  tcolumn *ptVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  LONGLONG LVar16;
  long local_c8;
  int local_bc;
  long local_b8;
  int local_ac;
  LONGLONG local_a8;
  long local_a0;
  tcolumn *local_98;
  LONGLONG local_90;
  char local_88 [88];
  
  uVar4 = (ulong)(uint)colnum;
  local_ac = 0;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if (fptr->Fptr->datastart == -1) {
      iVar8 = ffrdef(fptr,status);
      if (0 < iVar8) goto LAB_00147c01;
    }
    else if (writemode != 0xf && 0 < writemode) {
      if (STREAM_DRIVER - 0x29U < 0xffffffd8) {
        urltype2driver("stream://",&STREAM_DRIVER);
      }
      pFVar2 = fptr->Fptr;
      if (pFVar2->driver == STREAM_DRIVER) {
        lVar13 = pFVar2->datastart + -0xb40;
        if (lVar13 < pFVar2->headend) {
          lVar13 = pFVar2->headend;
        }
        if (pFVar2->ENDpos != lVar13) {
          ffwend(fptr,status);
        }
      }
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar2 = fptr->Fptr;
  iVar8 = pFVar2->hdutype;
  if (firstrow < 1) {
    if (iVar8 == 0) {
      pcVar14 = "Image group number is less than 1: %.0f";
    }
    else {
      pcVar14 = "Starting row number is less than 1: %.0f";
    }
    snprintf(local_88,0x51,pcVar14,SUB84((double)firstrow,0));
LAB_00147c33:
    ffxmsg(5,local_88);
    *status = 0x133;
    return 0x133;
  }
  if (firstelem < 1 && iVar8 != 1) {
    pcVar14 = "Starting element number less than 1: %ld";
LAB_00147b21:
    snprintf(local_88,0x51,pcVar14,firstelem);
LAB_00147b28:
    ffxmsg(5,local_88);
    *status = 0x134;
    iVar8 = 0x134;
  }
  else {
    if (nelem < 0) {
      snprintf(local_88,0x51,"Tried to read or write less than 0 elements: %.0f",
               SUB84((double)nelem,0));
      ffxmsg(5,local_88);
      *status = 0x132;
      return 0x132;
    }
    if ((colnum < 1) || (pFVar2->tfield < colnum)) {
      snprintf(local_88,0x51,"Specified column number is out of range: %d",uVar4);
      ffxmsg(5,local_88);
      snprintf(local_88,0x51,"  There are %d columns in this table.",(ulong)(uint)fptr->Fptr->tfield
              );
      ffxmsg(5,local_88);
      *status = 0x12e;
      return 0x12e;
    }
    *hdutype = iVar8;
    *rowlen = pFVar2->rowlength;
    lVar13 = pFVar2->datastart;
    ptVar3 = pFVar2->tableptr;
    *scale = ptVar3[uVar4 - 1].tscale;
    *zero = ptVar3[uVar4 - 1].tzero;
    *tnull = ptVar3[uVar4 - 1].tnull;
    local_90 = ptVar3[uVar4 - 1].tbcol;
    *twidth = ptVar3[uVar4 - 1].twidth;
    *incre = ptVar3[uVar4 - 1].twidth;
    *tcode = ptVar3[uVar4 - 1].tdatatype;
    *repeat = ptVar3[uVar4 - 1].trepeat;
    local_bc = colnum;
    local_a8 = nelem;
    strcpy(tform,ptVar3[uVar4 - 1].tform);
    local_a0 = uVar4 * 0xa0;
    local_98 = ptVar3;
    strcpy(snull,ptVar3[uVar4 - 1].strnull);
    ptVar3 = local_98;
    lVar11 = local_a0;
    LVar16 = local_a8;
    iVar8 = local_bc;
    if ((*hdutype == 1) && (*snull == '\0')) {
      builtin_strncpy(snull,"                 ",0x12);
      lVar15 = 0x11;
      if (*twidth < 0x12) {
        lVar15 = (long)(int)*twidth;
      }
      snull[lVar15] = '\0';
    }
    if (writemode - 0xfU < 4) {
      iVar9 = *tcode;
      if (((iVar9 + 0x10U & 0xffffffdf) == 0) && (*hdutype != 1)) {
        *incre = 1;
        if (iVar9 < 0) {
          *repeat = *twidth;
        }
        *twidth = 1;
        *scale = 1.0;
        *zero = 0.0;
        *tnull = 0x4995cdd1;
        *maxelem = 0x7080;
        iVar9 = 0xb;
        if (*tcode < 0) {
          iVar9 = -0xb;
        }
        *tcode = iVar9;
      }
      writemode = writemode + -0x10;
    }
    iVar9 = 0;
    if (writemode != -1) {
      iVar9 = writemode;
    }
    if ((*tcode + 1U & 0xfffffffd) == 0) {
      *tcode = *tcode * 0xb;
      lVar15 = *repeat + 7;
      lVar10 = *repeat + 0xe;
      if (-1 < lVar15) {
        lVar10 = lVar15;
      }
      *repeat = lVar10 >> 3;
    }
    iVar7 = *hdutype;
    if (iVar7 == 2) {
      if (*tcode == 0x10) {
        if (*twidth == 0) {
          *repeat = 0;
        }
        else {
          *repeat = *repeat / *twidth;
        }
      }
      else if (*tcode == -0x10) {
        *incre = 1;
        *twidth = local_a8;
      }
    }
    lVar15 = 0;
    if (iVar7 != 1) {
      lVar15 = firstelem + -1;
    }
    *elemnum = lVar15;
    uVar5 = *tcode;
    uVar12 = -uVar5;
    if (0 < (int)uVar5) {
      uVar12 = uVar5;
    }
    if (0x52 < uVar12) {
      if ((int)uVar5 < 1) {
        uVar5 = (int)((uVar5 - ((int)(uVar5 - 1) >> 0x1f)) + -1) >> 1;
      }
      else {
        uVar5 = uVar5 + 1 >> 1;
      }
      *tcode = uVar5;
      *repeat = *repeat << 1;
      *twidth = *twidth / 2;
      *incre = *incre / 2;
    }
    iVar7 = *tcode;
    iVar6 = -iVar7;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    if (iVar6 == 0x10) {
      lVar15 = *twidth;
      if (lVar15 == 0) {
        iVar7 = 0x707f;
      }
      else {
        iVar7 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x707f)) / SEXT816(lVar15),0);
      }
      *maxelem = iVar7;
      if (iVar7 == 0) {
        snprintf(local_88,0x51,"ASCII string column is too wide: %ld; max supported width is %d",
                 lVar15,0x707f);
        ffxmsg(5,local_88);
        *status = 0xec;
        return 0xec;
      }
    }
    else {
      if (iVar6 == 0x2a) {
        iVar7 = 0x1c20;
      }
      else if (iVar6 == 0x52) {
        iVar7 = 0xe10;
      }
      else {
        iVar7 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x7080)) / SEXT816(*twidth),0);
      }
      *maxelem = iVar7;
    }
    *startpos = local_90 + lVar13 + (firstrow + -1) * *rowlen;
    if (iVar9 == 0 || *hdutype != 0) {
      if (0 < *tcode) {
        lVar13 = *elemnum;
        if (lVar13 < *repeat) {
          lVar11 = (local_a8 + lVar13 + -1) / *repeat + firstrow;
          pFVar2 = fptr->Fptr;
          lVar13 = pFVar2->numrows;
          if (iVar9 == 0) {
            if ((writemode != -1) && (lVar13 < lVar11)) {
              if (*hdutype == 0) {
                if (lVar13 < firstrow) {
                  snprintf(local_88,0x51,"Attempted to read from group %ld of the HDU,",firstrow);
                  ffxmsg(5,local_88);
                  snprintf(local_88,0x51,"however the HDU only contains %ld group(s).",
                           fptr->Fptr->numrows);
                }
                else {
                  ffxmsg(5,"Attempt to read past end of array:");
                  snprintf(local_88,0x51,"  Image has  %ld elements;",*repeat);
                  ffxmsg(5,local_88);
                  snprintf(local_88,0x51,"  Tried to read %ld elements starting at element %ld.",
                           LVar16,firstelem);
                }
              }
              else {
                ffxmsg(5,"Attempt to read past end of table:");
                snprintf(local_88,0x51,"  Table has %.0f rows with %.0f elements per row;",
                         SUB84((double)fptr->Fptr->numrows,0),(double)*repeat);
                ffxmsg(5,local_88);
                snprintf(local_88,0x51,
                         "  Tried to read %.0f elements starting at row %.0f, element %.0f.",
                         SUB84((double)LVar16,0),(double)firstrow,(double)(*elemnum + 1));
              }
              goto LAB_00147c33;
            }
          }
          else if ((local_a8 != 0) && (lVar15 = lVar11 - lVar13, lVar15 != 0 && lVar13 <= lVar11)) {
            if ((pFVar2->lasthdu == 0) || (0 < pFVar2->heapsize)) {
              iVar8 = ffirow(fptr,lVar13,lVar15,status);
              if (0 < iVar8) goto LAB_00148464;
            }
            else {
              pFVar2->heapstart = pFVar2->heapstart + lVar15 * pFVar2->rowlength;
              pFVar2->numrows = lVar11;
            }
          }
          if (((iVar9 != 2) && (1 < LVar16)) && (*repeat == 1)) {
            *incre = *rowlen;
            goto LAB_00148037;
          }
          goto LAB_001485c6;
        }
        snprintf(local_88,0x51,"First element to write is too large: %ld; max allowed value is %ld",
                 lVar13 + 1);
        goto LAB_00147b28;
      }
      *tcode = -*tcode;
      if (iVar9 != 0) {
        *repeat = local_a8 + *elemnum;
        if ((firstrow <= fptr->Fptr->numrows) &&
           (ffgdesll(fptr,local_bc,firstrow,&local_c8,&local_b8,&local_ac), local_ac == 0)) {
          iVar9 = *(int *)(ptVar3->ttype + lVar11 + -0x50);
          if (iVar9 < -0x52) {
            local_c8 = local_c8 << 1;
          }
          else if (iVar9 == -1) {
            lVar15 = local_c8 + 0xe;
            if (-1 < local_c8 + 7) {
              lVar15 = local_c8 + 7;
            }
            local_c8 = lVar15 >> 3;
          }
          if (*repeat <= local_c8) {
            *startpos = lVar13 + local_b8 + fptr->Fptr->heapstart;
            lVar13 = *repeat / 2;
            if (-0x53 < iVar9) {
              lVar13 = *repeat;
            }
            ffpdes(fptr,iVar8,firstrow,lVar13,local_b8,status);
            return *status;
          }
        }
        lVar10 = fptr->Fptr->numrows;
        lVar15 = firstrow - lVar10;
        if ((lVar15 != 0 && lVar10 <= firstrow) &&
           (iVar9 = ffirow(fptr,lVar10,lVar15,status), 0 < iVar9)) {
LAB_00148464:
          snprintf(local_88,0x51,"Failed to add space for %.0f new rows in table.",
                   SUB84((double)lVar15,0));
LAB_0014848c:
          ffxmsg(5,local_88);
LAB_00147c01:
          return *status;
        }
        pFVar2 = fptr->Fptr;
        *startpos = pFVar2->heapstart + lVar13 + pFVar2->heapsize;
        lVar15 = *repeat / 2;
        if (-0x53 < *(int *)(ptVar3->ttype + lVar11 + -0x50)) {
          lVar15 = *repeat;
        }
        ffpdes(fptr,iVar8,firstrow,lVar15,pFVar2->heapsize,status);
        pFVar2 = fptr->Fptr;
        if (pFVar2->lasthdu == 0) {
          lVar13 = *incre * *repeat + lVar13 + pFVar2->heapstart + pFVar2->heapsize;
          if (pFVar2->headstart[(long)pFVar2->curhdu + 1] < lVar13) {
            lVar13 = (lVar13 + ~pFVar2->headstart[(long)pFVar2->curhdu + 1]) / 0xb40 + 1;
            iVar8 = ffiblk(fptr,lVar13,1,status);
            if (0 < iVar8) {
              snprintf(local_88,0x51,
                       "Failed to extend the size of the variable length heap by %ld blocks.",lVar13
                      );
              goto LAB_0014848c;
            }
          }
        }
        pLVar1 = &fptr->Fptr->heapsize;
        *pLVar1 = *pLVar1 + *incre * *repeat;
        goto LAB_001485c6;
      }
      if (fptr->Fptr->numrows < firstrow) {
        ffxmsg(5,"Attempt to read past end of table");
        snprintf(local_88,0x51,"  Table has %.0f rows and tried to read row %.0f.",
                 SUB84((double)fptr->Fptr->numrows,0),(double)firstrow);
        goto LAB_00147c33;
      }
      ffgdesll(fptr,local_bc,firstrow,&local_c8,&local_b8,status);
      *repeat = local_c8;
      if (*(int *)(ptVar3->ttype + lVar11 + -0x50) < -0x52) {
        lVar11 = local_c8 * 2;
LAB_0014833c:
        *repeat = lVar11;
      }
      else if (*(int *)(ptVar3->ttype + lVar11 + -0x50) == -1) {
        lVar11 = local_c8 + 0xe;
        if (-1 < local_c8 + 7) {
          lVar11 = local_c8 + 7;
        }
        lVar11 = lVar11 >> 3;
        goto LAB_0014833c;
      }
      if (*repeat <= *elemnum) {
        snprintf(local_88,0x51,
                 "Starting element to read in variable length column is too large: %ld",firstelem);
        ffxmsg(5,local_88);
        firstelem = *repeat;
        pcVar14 = "  This row only contains %ld elements";
        goto LAB_00147b21;
      }
      *startpos = lVar13 + local_b8 + fptr->Fptr->heapstart;
    }
    else {
      LVar16 = local_a8 + *elemnum;
      if (*repeat < LVar16) {
LAB_00148037:
        *repeat = LVar16;
      }
    }
LAB_001485c6:
    iVar8 = *status;
  }
  return iVar8;
}

Assistant:

int ffgcprll( fitsfile *fptr, /* I - FITS file pointer                      */
        int colnum,     /* I - column number (1 = 1st column of table)      */
        LONGLONG firstrow,  /* I - first row (1 = 1st row of table)         */
        LONGLONG firstelem, /* I - first element within vector (1 = 1st)    */
        LONGLONG nelem, /* I - number of elements to read or write          */
        int writemode,  /* I - = 1 if writing data, = 0 if reading data     */
                        /*     If = 2, then writing data, but don't modify  */
                        /*     the returned values of repeat and incre.     */
                        /*     If = -1, then reading data in reverse        */
                        /*     direction.                                   */
	                /*     If writemode has 16 added, then treat        */
	                /*        TSTRING column as TBYTE vector            */
        double *scale,  /* O - FITS scaling factor (TSCALn keyword value)   */
        double *zero,   /* O - FITS scaling zero pt (TZEROn keyword value)  */
        char *tform,    /* O - ASCII column format: value of TFORMn keyword */
        long *twidth,   /* O - width of ASCII column (characters)           */
        int *tcode,     /* O - abs(column datatype code): I*4=41, R*4=42, etc */
        int *maxelem,   /* O - max number of elements that fit in buffer    */
        LONGLONG *startpos,/* O - offset in file to starting row & column      */
        LONGLONG *elemnum, /* O - starting element number ( 0 = 1st element)   */
        long *incre,    /* O - byte offset between elements within a row    */
        LONGLONG *repeat,  /* O - number of elements in a row (vector column)  */
        LONGLONG *rowlen,  /* O - length of a row, in bytes                    */
        int  *hdutype,  /* O - HDU type: 0, 1, 2 = primary, table, bintable */
        LONGLONG *tnull,    /* O - null value for integer columns               */
        char *snull,    /* O - null value for ASCII table columns           */
        int *status)    /* IO - error status                                */
/*
  Get Column PaRameters, and test starting row and element numbers for 
  validity.  This is a workhorse routine that is call by nearly every
  other routine that reads or writes to FITS files.
*/
{
    int nulpos, rangecheck = 1, tstatus = 0;
    LONGLONG datastart, endpos;
    long nblock;
    LONGLONG heapoffset, lrepeat, endrow, nrows, tbcol;
    char message[FLEN_ERRMSG];
    tcolumn *colptr;

    if (fptr->HDUposition != (fptr->Fptr)->curhdu) {
        /* reset position to the correct HDU if necessary */
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    } else if ((fptr->Fptr)->datastart == DATA_UNDEFINED) {
        /* rescan header if data structure is undefined */
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    } else if (writemode > 0 && writemode != 15) {

	/* Only terminate the header with the END card if */
	/* writing to the stdout stream (don't have random access). */

	/* Initialize STREAM_DRIVER to be the device number for */
	/* writing FITS files directly out to the stdout stream. */
	/* This only needs to be done once and is thread safe. */
	if (STREAM_DRIVER <= 0 || STREAM_DRIVER > 40) {
            urltype2driver("stream://", &STREAM_DRIVER);
        }

        if ((fptr->Fptr)->driver == STREAM_DRIVER) {
	    if ((fptr->Fptr)->ENDpos != 
	       maxvalue((fptr->Fptr)->headend , (fptr->Fptr)->datastart -2880)) {
	           ffwend(fptr, status);
	    } 
	}
    }

    /* Do sanity check of input parameters */
    if (firstrow < 1)
    {
        if ((fptr->Fptr)->hdutype == IMAGE_HDU) /*  Primary Array or IMAGE */
        {
          snprintf(message,FLEN_ERRMSG, "Image group number is less than 1: %.0f",
                (double) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
        }
        else
        {
          snprintf(message, FLEN_ERRMSG,"Starting row number is less than 1: %.0f",
                (double) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
        }
    }
    else if ((fptr->Fptr)->hdutype != ASCII_TBL && firstelem < 1)
    {
        snprintf(message, FLEN_ERRMSG,"Starting element number less than 1: %ld",
               (long) firstelem);
        ffpmsg(message);
        return(*status = BAD_ELEM_NUM);
    }
    else if (nelem < 0)
    {
        snprintf(message, FLEN_ERRMSG,"Tried to read or write less than 0 elements: %.0f",
            (double) nelem);
        ffpmsg(message);
        return(*status = NEG_BYTES);
    }
    else if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        snprintf(message, FLEN_ERRMSG,"  There are %d columns in this table.",
                (fptr->Fptr)->tfield );
        ffpmsg(message);

        return(*status = BAD_COL_NUM);
    }

    /*  copy relevant parameters from the structure */

    *hdutype = (fptr->Fptr)->hdutype;    /* image, ASCII table, or BINTABLE  */
    *rowlen   = (fptr->Fptr)->rowlength; /* width of the table, in bytes     */
    datastart = (fptr->Fptr)->datastart; /* offset in file to start of table */

    colptr  = (fptr->Fptr)->tableptr;    /* point to first column */
    colptr += (colnum - 1);      /* offset to correct column structure */

    *scale    = colptr->tscale;  /* value scaling factor;    default = 1.0 */
    *zero     = colptr->tzero;   /* value scaling zeropoint; default = 0.0 */
    *tnull    = colptr->tnull;   /* null value for integer columns         */
    tbcol     = colptr->tbcol;   /* offset to start of column within row   */
    *twidth   = colptr->twidth;  /* width of a single datum, in bytes      */
    *incre    = colptr->twidth;  /* increment between datums, in bytes     */

    *tcode    = colptr->tdatatype;
    *repeat   = colptr->trepeat;

    strcpy(tform, colptr->tform);    /* value of TFORMn keyword            */
    strcpy(snull, colptr->strnull);  /* null value for ASCII table columns */

    if (*hdutype == ASCII_TBL && snull[0] == '\0')
    {
     /* In ASCII tables, a null value is equivalent to all spaces */

       strcpy(snull, "                 ");   /* maximum of 17 spaces */
       nulpos = minvalue(17, *twidth);      /* truncate to width of column */
       snull[nulpos] = '\0';
    }

    /* Special case: use writemode = 15,16,17,18 to interpret TSTRING columns
       as TBYTE vectors instead (but not for ASCII tables). 
          writemode = 15 equivalent to writemode =-1
          writemode = 16 equivalent to writemode = 0
          writemode = 17 equivalent to writemode = 1
          writemode = 18 equivalent to writemode = 2
    */
    if (writemode >= 15 && writemode <= 18) {

      if (abs(*tcode) == TSTRING && *hdutype != ASCII_TBL ) {
        *incre = 1;          /* each element is 1 byte wide */
	if (*tcode < 0) *repeat = *twidth;  /* variable columns appear to put width in *twidth */
        *twidth = 1;         /* width of each element */
        *scale = 1.0;        /* no scaling */
        *zero  = 0.0;
        *tnull = NULL_UNDEFINED;  /* don't test for nulls */
        *maxelem = DBUFFSIZE;

	if (*tcode < 0) {
	  *tcode = -TBYTE; /* variable-length */
	} else {
	  *tcode =  TBYTE;
	}
      }

      /* translate to the equivalent as listed above */
      writemode -= 16;
    }

    /* Special case:  interpret writemode = -1 as reading data, but */
    /* don't do error check for exceeding the range of pixels  */
    if (writemode == -1)
    {
      writemode = 0;
      rangecheck = 0;
    }

    /* Special case: interprete 'X' column as 'B' */
    if (abs(*tcode) == TBIT)
    {
        *tcode  = *tcode / TBIT * TBYTE;
        *repeat = (*repeat + 7) / 8;
    }

    /* Special case: support the 'rAw' format in BINTABLEs */
    if (*hdutype == BINARY_TBL && *tcode == TSTRING) {
       if (*twidth)
          *repeat = *repeat / *twidth;  /* repeat = # of unit strings in field */
       else
          *repeat = 0;
    }
    else if (*hdutype == BINARY_TBL && *tcode == -TSTRING) {
       /* variable length string */
       *incre = 1;
       *twidth = (long) nelem;
    }

    if (*hdutype == ASCII_TBL)
        *elemnum = 0;   /* ASCII tables don't have vector elements */
    else
        *elemnum = firstelem - 1;

    /* interprete complex and double complex as pairs of floats or doubles */
    if (abs(*tcode) >= TCOMPLEX)
    {
        if (*tcode > 0)
          *tcode = (*tcode + 1) / 2;
        else
          *tcode = (*tcode - 1) / 2;

        *repeat  = *repeat * 2;
        *twidth  = *twidth / 2;
        *incre   = *incre  / 2;
    }

    /* calculate no. of pixels that fit in buffer */
    /* allow for case where floats are 8 bytes long */
    if (abs(*tcode) == TFLOAT)
       *maxelem = DBUFFSIZE / sizeof(float);
    else if (abs(*tcode) == TDOUBLE)
       *maxelem = DBUFFSIZE / sizeof(double);
    else if (abs(*tcode) == TSTRING)
    {
       if (*twidth)
          *maxelem = (DBUFFSIZE - 1)/ *twidth; /* leave room for final \0 */
       else
          *maxelem = DBUFFSIZE - 1;
          
       if (*maxelem == 0) {
            snprintf(message,FLEN_ERRMSG,
        "ASCII string column is too wide: %ld; max supported width is %d",
                   *twidth,  DBUFFSIZE - 1);
            ffpmsg(message);
            return(*status = COL_TOO_WIDE);
        }
    }
    else
       *maxelem = DBUFFSIZE / *twidth; 

    /* calc starting byte position to 1st element of col  */
    /*  (this does not apply to variable length columns)  */
    *startpos = datastart + ((LONGLONG)(firstrow - 1) * *rowlen) + tbcol;

    if (*hdutype == IMAGE_HDU && writemode) /*  Primary Array or IMAGE */
    { /*
        For primary arrays, set the repeat count greater than the total
        number of pixels to be written.  This prevents an out-of-range
        error message in cases where the final image array size is not
        yet known or defined.
      */
        if (*repeat < *elemnum + nelem)
            *repeat = *elemnum + nelem; 
    }
    else if (*tcode > 0)     /*  Fixed length table column  */
    {
        if (*elemnum >= *repeat)
        {
            snprintf(message,FLEN_ERRMSG,
        "First element to write is too large: %ld; max allowed value is %ld",
                   (long) ((*elemnum) + 1), (long) *repeat);
            ffpmsg(message);
            return(*status = BAD_ELEM_NUM);
        }

        /* last row number to be read or written */
        endrow = ((*elemnum + nelem - 1) / *repeat) + firstrow;

        if (writemode)
        {
            /* check if we are writing beyond the current end of table */
            if ((endrow > (fptr->Fptr)->numrows) && (nelem > 0) )
            {
                /* if there are more HDUs following the current one, or */
                /* if there is a data heap, then we must insert space */
                /* for the new rows.  */
                if ( !((fptr->Fptr)->lasthdu) || (fptr->Fptr)->heapsize > 0)
                {
                    nrows = endrow - ((fptr->Fptr)->numrows);
                    if (ffirow(fptr, (fptr->Fptr)->numrows, nrows, status) > 0)
                    {
                       snprintf(message,FLEN_ERRMSG,
                       "Failed to add space for %.0f new rows in table.",
                       (double) nrows);
                       ffpmsg(message);
                       return(*status);
                    }
                }
                else
                {
                  /* update heap starting address */
                  (fptr->Fptr)->heapstart += 
                  ((LONGLONG)(endrow - (fptr->Fptr)->numrows) * 
                          (fptr->Fptr)->rowlength );

                  (fptr->Fptr)->numrows = endrow; /* update number of rows */
                }
            }
        }
        else  /* reading from the file */
        {
          if ( endrow > (fptr->Fptr)->numrows && rangecheck)
          {
            if (*hdutype == IMAGE_HDU) /*  Primary Array or IMAGE */
            {
              if (firstrow > (fptr->Fptr)->numrows)
              {
                snprintf(message, FLEN_ERRMSG,
                  "Attempted to read from group %ld of the HDU,", (long) firstrow);
                ffpmsg(message);

                snprintf(message, FLEN_ERRMSG,
                  "however the HDU only contains %ld group(s).",
                   (long) ((fptr->Fptr)->numrows) );
                ffpmsg(message);
              }
              else
              {
                ffpmsg("Attempt to read past end of array:");
                snprintf(message, FLEN_ERRMSG,
                  "  Image has  %ld elements;", (long) *repeat);
                ffpmsg(message);

                snprintf(message, FLEN_ERRMSG, 
                "  Tried to read %ld elements starting at element %ld.",
                (long) nelem, (long) firstelem);
                ffpmsg(message);
              }
            }
            else
            {
              ffpmsg("Attempt to read past end of table:");
              snprintf(message, FLEN_ERRMSG,
                "  Table has %.0f rows with %.0f elements per row;",
                    (double) ((fptr->Fptr)->numrows), (double) *repeat);
              ffpmsg(message);

              snprintf(message, FLEN_ERRMSG,
              "  Tried to read %.0f elements starting at row %.0f, element %.0f.",
              (double) nelem, (double) firstrow, (double) ((*elemnum) + 1));
              ffpmsg(message);

            }
            return(*status = BAD_ROW_NUM);
          }
        }

        if (*repeat == 1 && nelem > 1 && writemode != 2)
        { /*
            When accessing a scalar column, fool the calling routine into
            thinking that this is a vector column with very big elements.
            This allows multiple values (up to the maxelem number of elements
            that will fit in the buffer) to be read or written with a single
            routine call, which increases the efficiency.

            If writemode == 2, then the calling program does not want to
            have this efficiency trick applied.
          */           
            if (*rowlen <= LONG_MAX) {
                *incre = (long) *rowlen;
                *repeat = nelem;
            }
        }
    }
    else    /*  Variable length Binary Table column */
    {
      *tcode *= (-1);  

      if (writemode)    /* return next empty heap address for writing */
      {

        *repeat = nelem + *elemnum; /* total no. of elements in the field */

        /* first, check if we are overwriting an existing row, and */
        /* if so, if the existing space is big enough for the new vector */

        if ( firstrow <= (fptr->Fptr)->numrows )
        {
          ffgdesll(fptr, colnum, firstrow, &lrepeat, &heapoffset, &tstatus);
          if (!tstatus)
          {
            if (colptr->tdatatype <= -TCOMPLEX)
              lrepeat = lrepeat * 2;  /* no. of float or double values */
            else if (colptr->tdatatype == -TBIT)
              lrepeat = (lrepeat + 7) / 8;  /* convert from bits to bytes */

            if (lrepeat >= *repeat)  /* enough existing space? */
            {
              *startpos = datastart + heapoffset + (fptr->Fptr)->heapstart;

              /*  write the descriptor into the fixed length part of table */
              if (colptr->tdatatype <= -TCOMPLEX)
              {
                /* divide repeat count by 2 to get no. of complex values */
                ffpdes(fptr, colnum, firstrow, *repeat / 2, 
                      heapoffset, status);
              }
              else
              {
                ffpdes(fptr, colnum, firstrow, *repeat,
                      heapoffset, status);
              }
              return(*status);
            }
          }
        }

        /* Add more rows to the table, if writing beyond the end. */
        /* It is necessary to shift the heap down in this case */
        if ( firstrow > (fptr->Fptr)->numrows)
        {
            nrows = firstrow - ((fptr->Fptr)->numrows);
            if (ffirow(fptr, (fptr->Fptr)->numrows, nrows, status) > 0)
            {
                snprintf(message,FLEN_ERRMSG,
                "Failed to add space for %.0f new rows in table.",
                       (double) nrows);
                ffpmsg(message);
                return(*status);
            }
        }

        /*  calculate starting position (for writing new data) in the heap */
        *startpos = datastart + (fptr->Fptr)->heapstart + 
                    (fptr->Fptr)->heapsize;

        /*  write the descriptor into the fixed length part of table */
        if (colptr->tdatatype <= -TCOMPLEX)
        {
          /* divide repeat count by 2 to get no. of complex values */
          ffpdes(fptr, colnum, firstrow, *repeat / 2, 
                (fptr->Fptr)->heapsize, status);
        }
        else
        {
          ffpdes(fptr, colnum, firstrow, *repeat, (fptr->Fptr)->heapsize,
                 status);
        }

        /* If this is not the last HDU in the file, then check if */
        /* extending the heap would overwrite the following header. */
        /* If so, then have to insert more blocks. */
        if ( !((fptr->Fptr)->lasthdu) )
        {
            endpos = datastart + (fptr->Fptr)->heapstart + 
                     (fptr->Fptr)->heapsize + ( *repeat * (*incre));

            if (endpos > (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1])
            {
                /* calc the number of blocks that need to be added */
                nblock = (long) (((endpos - 1 - 
                         (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] ) 
                         / 2880) + 1);

                if (ffiblk(fptr, nblock, 1, status) > 0) /* insert blocks */
                {
                  snprintf(message,FLEN_ERRMSG,
       "Failed to extend the size of the variable length heap by %ld blocks.",
                   nblock);
                   ffpmsg(message);
                   return(*status);
                }
            }
        }

        /* increment the address to the next empty heap position */
        (fptr->Fptr)->heapsize += ( *repeat * (*incre)); 
      }
      else    /*  get the read start position in the heap */
      {
        if ( firstrow > (fptr->Fptr)->numrows)
        {
            ffpmsg("Attempt to read past end of table");
            snprintf(message,FLEN_ERRMSG, 
                "  Table has %.0f rows and tried to read row %.0f.",
                (double) ((fptr->Fptr)->numrows), (double) firstrow);
            ffpmsg(message);
            return(*status = BAD_ROW_NUM);
        }

        ffgdesll(fptr, colnum, firstrow, &lrepeat, &heapoffset, status);
        *repeat = lrepeat;

        if (colptr->tdatatype <= -TCOMPLEX)
            *repeat = *repeat * 2;  /* no. of float or double values */
        else if (colptr->tdatatype == -TBIT)
            *repeat = (*repeat + 7) / 8;  /* convert from bits to bytes */

        if (*elemnum >= *repeat)
        {
            snprintf(message,FLEN_ERRMSG, 
         "Starting element to read in variable length column is too large: %ld",
                    (long) firstelem);
            ffpmsg(message);
            snprintf(message,FLEN_ERRMSG, 
         "  This row only contains %ld elements", (long) *repeat);
            ffpmsg(message);
            return(*status = BAD_ELEM_NUM);
        }

        *startpos = datastart + heapoffset + (fptr->Fptr)->heapstart;
      }
    }
    return(*status);
}